

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O3

size_t mz_zip_reader_extract_iter_read
                 (mz_zip_reader_extract_iter_state *pState,void *pvBuf,size_t buf_size)

{
  mz_uint8 *pOut_buf_next;
  mz_zip_archive *pmVar1;
  tinfl_status tVar2;
  size_t sVar3;
  mz_ulong mVar4;
  ulong uVar5;
  mz_uint8 *pOut_buf_start;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  undefined1 auVar8 [16];
  size_t out_buf_size;
  size_t in_buf_size;
  ulong local_48;
  size_t local_40;
  tinfl_decompressor *local_38;
  
  if (((pState == (mz_zip_reader_extract_iter_state *)0x0) ||
      (pmVar1 = pState->pZip, pmVar1 == (mz_zip_archive *)0x0)) ||
     (pvBuf == (void *)0x0 || pmVar1->m_pState == (mz_zip_internal_state *)0x0)) {
    buf_size = 0;
  }
  else {
    if (((pState->flags & 0x400) == 0) && ((pState->file_stat).m_method != 0)) {
      local_38 = &pState->inflator;
      uVar5 = pState->out_blk_remain;
      uVar7 = 0;
      do {
        pOut_buf_start = (mz_uint8 *)pState->pWrite_buf;
        local_48 = (ulong)((uint)pState->out_buf_ofs & 0x7fff);
        pOut_buf_next = pOut_buf_start + local_48;
        local_48 = 0x8000 - local_48;
        if (uVar5 == 0) {
          sVar3 = pState->read_buf_avail;
          if (sVar3 == 0) {
            pmVar1 = pState->pZip;
            uVar5 = pState->comp_remaining;
            if (pmVar1->m_pState->m_pMem == (void *)0x0) {
              if (pState->read_buf_size < uVar5) {
                uVar5 = pState->read_buf_size;
              }
              pState->read_buf_avail = uVar5;
              sVar3 = (*pmVar1->m_pRead)(pmVar1->m_pIO_opaque,pState->cur_file_ofs,pState->pRead_buf
                                         ,uVar5);
              if (sVar3 != pState->read_buf_avail) {
                if (pState->pZip != (mz_zip_archive *)0x0) {
                  pState->pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                }
                goto LAB_00258048;
              }
              pState->cur_file_ofs = pState->cur_file_ofs + sVar3;
              uVar5 = pState->comp_remaining - sVar3;
              pState->comp_remaining = uVar5;
              pState->read_buf_ofs = 0;
              pOut_buf_start = (mz_uint8 *)pState->pWrite_buf;
            }
            else {
              sVar3 = 0;
            }
          }
          else {
            uVar5 = pState->comp_remaining;
          }
          local_40 = sVar3;
          tVar2 = tinfl_decompress(local_38,(mz_uint8 *)
                                            ((long)pState->pRead_buf + pState->read_buf_ofs),
                                   &local_40,pOut_buf_start,pOut_buf_next,&local_48,
                                   (uint)(uVar5 != 0) * 2);
          pState->status = tVar2;
          pState->read_buf_avail = pState->read_buf_avail - local_40;
          pState->read_buf_ofs = pState->read_buf_ofs + local_40;
          pState->out_blk_remain = local_48;
          uVar5 = local_48;
          if (local_48 != 0) goto LAB_00257f1b;
          uVar5 = 0;
        }
        else {
LAB_00257f1b:
          __n = buf_size - uVar7;
          if (uVar5 <= buf_size - uVar7) {
            __n = uVar5;
          }
          memcpy((void *)((long)pvBuf + uVar7),pOut_buf_next,__n);
          mVar4 = mz_crc32((ulong)pState->file_crc32,pOut_buf_next,__n);
          pState->file_crc32 = (mz_uint)mVar4;
          uVar5 = pState->out_blk_remain - __n;
          pState->out_blk_remain = uVar5;
          uVar6 = pState->out_buf_ofs + __n;
          pState->out_buf_ofs = uVar6;
          if ((pState->file_stat).m_uncomp_size < uVar6) {
            if (pState->pZip != (mz_zip_archive *)0x0) {
              pState->pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
            }
LAB_00258048:
            pState->status = -1;
            return uVar7;
          }
          uVar7 = uVar7 + __n;
        }
        if (buf_size <= uVar7) {
          return uVar7;
        }
        if (1 < pState->status - 1U) {
          return uVar7;
        }
      } while( true );
    }
    if (pState->comp_remaining < buf_size) {
      buf_size = pState->comp_remaining;
    }
    if (pmVar1->m_pState->m_pMem == (void *)0x0) {
      sVar3 = (*pmVar1->m_pRead)(pmVar1->m_pIO_opaque,pState->cur_file_ofs,pvBuf,buf_size);
      if (sVar3 != buf_size) {
        if (pState->pZip != (mz_zip_archive *)0x0) {
          pState->pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        }
        pState->status = -1;
        buf_size = 0;
      }
    }
    else {
      memcpy(pvBuf,pState->pRead_buf,buf_size);
      pState->pRead_buf = (void *)((long)pState->pRead_buf + buf_size);
    }
    if ((pState->flags & 0x400) == 0) {
      mVar4 = mz_crc32((ulong)pState->file_crc32,(mz_uint8 *)pvBuf,buf_size);
      pState->file_crc32 = (mz_uint)mVar4;
    }
    auVar8._8_4_ = (int)buf_size;
    auVar8._0_8_ = buf_size;
    auVar8._12_4_ = (int)(buf_size >> 0x20);
    pState->out_buf_ofs = buf_size + pState->out_buf_ofs;
    pState->cur_file_ofs = auVar8._8_8_ + pState->cur_file_ofs;
    pState->comp_remaining = pState->comp_remaining - buf_size;
  }
  return buf_size;
}

Assistant:

size_t mz_zip_reader_extract_iter_read(mz_zip_reader_extract_iter_state* pState, void* pvBuf, size_t buf_size)
{
    size_t copied_to_caller = 0;

    /* Argument sanity check */
    if ((!pState) || (!pState->pZip) || (!pState->pZip->m_pState) || (!pvBuf))
        return 0;

    if ((pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!pState->file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data, calc amount to return. */
        copied_to_caller = (size_t)MZ_MIN( buf_size, pState->comp_remaining );

        /* Zip is in memory....or requires reading from a file? */
        if (pState->pZip->m_pState->m_pMem)
        {
            /* Copy data to caller's buffer */
            memcpy( pvBuf, pState->pRead_buf, copied_to_caller );
            pState->pRead_buf = ((mz_uint8*)pState->pRead_buf) + copied_to_caller;
        }
        else
        {
            /* Read directly into caller's buffer */
            if (pState->pZip->m_pRead(pState->pZip->m_pIO_opaque, pState->cur_file_ofs, pvBuf, copied_to_caller) != copied_to_caller)
            {
                /* Failed to read all that was asked for, flag failure and alert user */
                mz_zip_set_error(pState->pZip, MZ_ZIP_FILE_READ_FAILED);
                pState->status = TINFL_STATUS_FAILED;
                copied_to_caller = 0;
            }
        }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        /* Compute CRC if not returning compressed data only */
        if (!(pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
            pState->file_crc32 = (mz_uint32)mz_crc32(pState->file_crc32, (const mz_uint8 *)pvBuf, copied_to_caller);
#endif

        /* Advance offsets, dec counters */
        pState->cur_file_ofs += copied_to_caller;
        pState->out_buf_ofs += copied_to_caller;
        pState->comp_remaining -= copied_to_caller;
    }
    else
    {
        do
        {
            /* Calc ptr to write buffer - given current output pos and block size */
            mz_uint8 *pWrite_buf_cur = (mz_uint8 *)pState->pWrite_buf + (pState->out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));

            /* Calc max output size - given current output pos and block size */
            size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (pState->out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));

            if (!pState->out_blk_remain)
            {
                /* Read more data from file if none available (and reading from file) */
                if ((!pState->read_buf_avail) && (!pState->pZip->m_pState->m_pMem))
                {
                    /* Calc read size */
                    pState->read_buf_avail = MZ_MIN(pState->read_buf_size, pState->comp_remaining);
                    if (pState->pZip->m_pRead(pState->pZip->m_pIO_opaque, pState->cur_file_ofs, pState->pRead_buf, (size_t)pState->read_buf_avail) != pState->read_buf_avail)
                    {
                        mz_zip_set_error(pState->pZip, MZ_ZIP_FILE_READ_FAILED);
                        pState->status = TINFL_STATUS_FAILED;
                        break;
                    }

                    /* Advance offsets, dec counters */
                    pState->cur_file_ofs += pState->read_buf_avail;
                    pState->comp_remaining -= pState->read_buf_avail;
                    pState->read_buf_ofs = 0;
                }

                /* Perform decompression */
                in_buf_size = (size_t)pState->read_buf_avail;
                pState->status = tinfl_decompress(&pState->inflator, (const mz_uint8 *)pState->pRead_buf + pState->read_buf_ofs, &in_buf_size, (mz_uint8 *)pState->pWrite_buf, pWrite_buf_cur, &out_buf_size, pState->comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                pState->read_buf_avail -= in_buf_size;
                pState->read_buf_ofs += in_buf_size;

                /* Update current output block size remaining */
                pState->out_blk_remain = out_buf_size;
            }

            if (pState->out_blk_remain)
            {
                /* Calc amount to return. */
                size_t to_copy = MZ_MIN( (buf_size - copied_to_caller), pState->out_blk_remain );

                /* Copy data to caller's buffer */
                memcpy( (uint8_t*)pvBuf + copied_to_caller, pWrite_buf_cur, to_copy );

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                /* Perform CRC */
                pState->file_crc32 = (mz_uint32)mz_crc32(pState->file_crc32, pWrite_buf_cur, to_copy);
#endif

                /* Decrement data consumed from block */
                pState->out_blk_remain -= to_copy;

                /* Inc output offset, while performing sanity check */
                if ((pState->out_buf_ofs += to_copy) > pState->file_stat.m_uncomp_size)
                {
                    mz_zip_set_error(pState->pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                    pState->status = TINFL_STATUS_FAILED;
                    break;
                }

                /* Increment counter of data copied to caller */
                copied_to_caller += to_copy;
            }
        } while ( (copied_to_caller < buf_size) && ((pState->status == TINFL_STATUS_NEEDS_MORE_INPUT) || (pState->status == TINFL_STATUS_HAS_MORE_OUTPUT)) );
    }

    /* Return how many bytes were copied into user buffer */
    return copied_to_caller;
}